

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.h
# Opt level: O3

bool Js::PropertyRecordStringHashComparer<Js::JavascriptString_*>::Equals
               (JavascriptString *str1,PropertyRecord *str2)

{
  charcount_t cVar1;
  int iVar2;
  PropertyRecord *string1;
  bool bVar3;
  
  cVar1 = JavascriptString::GetLength(str1);
  if ((cVar1 == str2->byteCount >> 1) && (0xf < (uint)str2->pid)) {
    string1 = (PropertyRecord *)JavascriptString::GetString(str1);
    cVar1 = JavascriptString::GetLength(str1);
    if (string1 == str2 + 1) {
      bVar3 = true;
    }
    else {
      iVar2 = PAL_wmemcmp((char16_t *)string1,(char16_t *)(str2 + 1),(ulong)cVar1);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

inline static bool Equals(JavascriptString * str1, PropertyRecord const * str2)
        {
            return (str1->GetLength() == str2->GetLength() && !Js::IsInternalPropertyId(str2->GetPropertyId()) &&
                JsUtil::CharacterBuffer<WCHAR>::StaticEquals(str1->GetString(), str2->GetBuffer(), str1->GetLength()));
        }